

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_eff_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  blow_effect *eff;
  blow_effect *h;
  char *name;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x38);
  v[6] = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  *v = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_eff_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct blow_effect *h = parser_priv(p);

	struct blow_effect *eff = mem_zalloc(sizeof *eff);
	eff->next = h;
	parser_setpriv(p, eff);
	eff->name = string_make(name);

	return PARSE_ERROR_NONE;
}